

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

FunctionTypeWeakRefList * __thiscall
Js::FunctionProxy::EnsureFunctionObjectTypeList(FunctionProxy *this)

{
  ScriptContext *this_00;
  Recycler *pRVar1;
  TrackAllocData local_48;
  Recycler *local_20;
  Recycler *recycler;
  FunctionTypeWeakRefList *functionObjectTypeList;
  FunctionProxy *this_local;
  
  functionObjectTypeList = (FunctionTypeWeakRefList *)this;
  recycler = (Recycler *)GetFunctionObjectTypeList(this);
  if (recycler == (Recycler *)0x0) {
    this_00 = GetScriptContext(this);
    pRVar1 = ScriptContext::GetRecycler(this_00);
    local_20 = pRVar1;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,
               (type_info *)
               &JsUtil::
                List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x877);
    pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
    pRVar1 = (Recycler *)new<Memory::Recycler>(0x30,pRVar1,0x43c4b0);
    JsUtil::
    List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
    ::List((List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
            *)pRVar1,local_20,4);
    recycler = pRVar1;
    SetFunctionObjectTypeList(this,(FunctionTypeWeakRefList *)pRVar1);
  }
  return (FunctionTypeWeakRefList *)recycler;
}

Assistant:

FunctionProxy::FunctionTypeWeakRefList* FunctionProxy::EnsureFunctionObjectTypeList()
    {
        FunctionTypeWeakRefList* functionObjectTypeList = this->GetFunctionObjectTypeList();
        if (functionObjectTypeList == nullptr)
        {
            Recycler* recycler = this->GetScriptContext()->GetRecycler();
            functionObjectTypeList = RecyclerNew(recycler, FunctionTypeWeakRefList, recycler);
            this->SetFunctionObjectTypeList(functionObjectTypeList);
        }

        return functionObjectTypeList;
    }